

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O0

LoopShape * __thiscall CFG::Relooper::AddLoopShape(Relooper *this)

{
  int iVar1;
  pointer pLVar2;
  unique_ptr<CFG::Shape,_std::default_delete<CFG::Shape>_> local_28;
  pointer local_20;
  LoopShape *shapePtr;
  __single_object shape;
  Relooper *this_local;
  
  shape._M_t.super___uniq_ptr_impl<CFG::LoopShape,_std::default_delete<CFG::LoopShape>_>._M_t.
  super__Tuple_impl<0UL,_CFG::LoopShape_*,_std::default_delete<CFG::LoopShape>_>.
  super__Head_base<0UL,_CFG::LoopShape_*,_false>._M_head_impl =
       (__uniq_ptr_data<CFG::LoopShape,_std::default_delete<CFG::LoopShape>,_true,_true>)
       (__uniq_ptr_data<CFG::LoopShape,_std::default_delete<CFG::LoopShape>,_true,_true>)this;
  std::make_unique<CFG::LoopShape>();
  iVar1 = this->ShapeIdCounter;
  this->ShapeIdCounter = iVar1 + 1;
  pLVar2 = std::unique_ptr<CFG::LoopShape,_std::default_delete<CFG::LoopShape>_>::operator->
                     ((unique_ptr<CFG::LoopShape,_std::default_delete<CFG::LoopShape>_> *)&shapePtr)
  ;
  (pLVar2->super_Shape).Id = iVar1;
  local_20 = std::unique_ptr<CFG::LoopShape,_std::default_delete<CFG::LoopShape>_>::get
                       ((unique_ptr<CFG::LoopShape,_std::default_delete<CFG::LoopShape>_> *)
                        &shapePtr);
  std::unique_ptr<CFG::Shape,std::default_delete<CFG::Shape>>::
  unique_ptr<CFG::LoopShape,std::default_delete<CFG::LoopShape>,void>
            ((unique_ptr<CFG::Shape,std::default_delete<CFG::Shape>> *)&local_28,
             (unique_ptr<CFG::LoopShape,_std::default_delete<CFG::LoopShape>_> *)&shapePtr);
  std::
  deque<std::unique_ptr<CFG::Shape,_std::default_delete<CFG::Shape>_>,_std::allocator<std::unique_ptr<CFG::Shape,_std::default_delete<CFG::Shape>_>_>_>
  ::push_back(&this->Shapes,(value_type *)&local_28);
  std::unique_ptr<CFG::Shape,_std::default_delete<CFG::Shape>_>::~unique_ptr(&local_28);
  pLVar2 = local_20;
  std::unique_ptr<CFG::LoopShape,_std::default_delete<CFG::LoopShape>_>::~unique_ptr
            ((unique_ptr<CFG::LoopShape,_std::default_delete<CFG::LoopShape>_> *)&shapePtr);
  return pLVar2;
}

Assistant:

LoopShape* Relooper::AddLoopShape() {
  auto shape = std::make_unique<LoopShape>();
  shape->Id = ShapeIdCounter++;
  auto* shapePtr = shape.get();
  Shapes.push_back(std::move(shape));
  return shapePtr;
}